

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

err_t Node_Constructor(anynode *AnyNode,node *Node,size_t Size,fourcc_t ClassId)

{
  nodecontext *p_00;
  nodeclass *pnVar1;
  bool_t bVar2;
  nodecontext *p;
  nodeclass *Class;
  err_t Err;
  fourcc_t ClassId_local;
  size_t Size_local;
  node *Node_local;
  anynode *AnyNode_local;
  
  if (AnyNode == (anynode *)0x0) {
    __assert_fail("(const void*)(AnyNode)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x35f,"err_t Node_Constructor(anynode *, node *, size_t, fourcc_t)");
  }
  p_00 = (nodecontext *)**(undefined8 **)((long)AnyNode + 8);
  memset(Node,0,Size);
  Node->RefCount = 1;
  pnVar1 = NodeContext_FindClass(p_00,ClassId);
  if ((pnVar1 == (nodeclass *)0x0) ||
     (pnVar1 = LockModulesWithLock(p_00,pnVar1), pnVar1 == (nodeclass *)0x0)) {
    Class = (nodeclass *)0xfffffffffffffffb;
  }
  else {
    Node->FourCC = ClassId;
    Node->Magic = 0xf0de0a6c;
    Node->VMT = pnVar1 + 1;
    Class = (nodeclass *)CallCreate(p_00,Node,pnVar1);
    if (Class == (nodeclass *)0x0) {
      if ((pnVar1->Flags & 1) != 0) {
        if ((pnVar1->Flags & 0x20) == 0) {
          __assert_fail("Class->Flags & CFLAG_OWN_MEMORY",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0x372,"err_t Node_Constructor(anynode *, node *, size_t, fourcc_t)");
        }
        bVar2 = AddSingleton(p_00,Node);
        if (bVar2 == 0) {
          Node_Destructor(Node);
          return -2;
        }
        Node_AddRef(Node);
      }
    }
    else {
      Node->VMT = (void *)0x0;
      UnlockModules(pnVar1);
    }
  }
  return (err_t)Class;
}

Assistant:

err_t Node_Constructor(anynode* AnyNode, node* Node, size_t Size, fourcc_t ClassId)
{
    err_t Err;
    const nodeclass* Class;
    nodecontext* p = Node_Context(AnyNode);

    memset(Node,0,Size);
    Node->RefCount = 1;

    Class = NodeContext_FindClass(p,ClassId);
    if (Class && (Class = LockModulesWithLock(p,Class)) != NULL)
    {
#ifdef CONFIG_DEBUGCHECKS
        Node->FourCC = ClassId;
        Node->Magic = NODE_MAGIC;
#endif
        Node->VMT = Class+1;

        Err = CallCreate(p,Node,Class);
        if (Err == ERR_NONE)
        {
            if (Class->Flags & CFLAG_SINGLETON)
            {
                assert(Class->Flags & CFLAG_OWN_MEMORY);

                if (!AddSingleton(p,Node))
                {
                    Node_Destructor(Node);
                    return ERR_OUT_OF_MEMORY;
                }

                Node_AddRef(Node);
            }
        }
        else
        {
            Node->VMT = NULL;
            UnlockModules(Class);
        }
    }
    else
        Err = ERR_NOT_SUPPORTED;

    return Err;
}